

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcPermit::IfcPermit(IfcPermit *this)

{
  *(undefined ***)&this->field_0x110 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0x118 = 0;
  *(char **)&this->field_0x120 = "IfcPermit";
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__0086a9b0);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x86a8d0;
  *(undefined8 *)&this->field_0x110 = 0x86a998;
  *(undefined8 *)&this->field_0x88 = 0x86a8f8;
  *(undefined8 *)&this->field_0x98 = 0x86a920;
  *(undefined8 *)&this->field_0xd0 = 0x86a948;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x86a970;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>).field_0x18 = 0
  ;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcPermit() : Object("IfcPermit") {}